

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_text(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *this,iterator begin,iterator end)

{
  ulong uVar1;
  basic_buffer<char> *pbVar2;
  size_t sVar3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  basic_buffer<char> *c;
  char *pcVar7;
  
  pcVar6 = begin.ptr_;
  lVar5 = (long)end.ptr_ - (long)pcVar6;
  if (-1 < lVar5) {
    pbVar2 = (this->context).
             super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
             .out_.container;
    sVar3 = pbVar2->size_;
    uVar1 = sVar3 + lVar5;
    if (pbVar2->capacity_ < uVar1) {
      (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1,begin.end_,end.ptr_,end.end_);
    }
    pbVar2->size_ = uVar1;
    if (lVar5 != 0) {
      pcVar7 = pbVar2->ptr_ + sVar3;
      lVar5 = lVar5 + 1;
      do {
        if (pcVar6 == begin.end_) {
          cVar4 = '\0';
        }
        else {
          cVar4 = *pcVar6;
        }
        *pcVar7 = cVar4;
        pcVar6 = pcVar6 + 1;
        pcVar7 = pcVar7 + 1;
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    (this->context).
    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    .out_.container = pbVar2;
    return;
  }
  __assert_fail("(value >= 0) && \"negative value\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/core.h"
                ,0xd3,
                "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
               );
}

Assistant:

void on_text(iterator begin, iterator end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto &&it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }